

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall diligent_spirv_cross::Compiler::flush_all_active_variables(Compiler *this)

{
  size_t sVar1;
  TypedID<(diligent_spirv_cross::Types)2> *pTVar2;
  Parameter *pPVar3;
  uint *puVar4;
  SPIRVariable *pSVar5;
  SPIRFunction *pSVar6;
  long lVar7;
  
  pSVar6 = this->current_function;
  sVar1 = (pSVar6->local_variables).
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.
          buffer_size;
  if (sVar1 != 0) {
    pTVar2 = (pSVar6->local_variables).
             super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.ptr;
    lVar7 = 0;
    do {
      pSVar5 = Variant::get<diligent_spirv_cross::SPIRVariable>
                         ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                          *(uint *)((long)&pTVar2->id + lVar7));
      flush_dependees(this,pSVar5);
      lVar7 = lVar7 + 4;
    } while (sVar1 << 2 != lVar7);
    pSVar6 = this->current_function;
  }
  sVar1 = (pSVar6->arguments).super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>.
          buffer_size;
  if (sVar1 != 0) {
    pPVar3 = (pSVar6->arguments).super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>.ptr
    ;
    lVar7 = 0;
    do {
      pSVar5 = Variant::get<diligent_spirv_cross::SPIRVariable>
                         ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                          *(uint *)((long)&(pPVar3->id).id + lVar7));
      flush_dependees(this,pSVar5);
      lVar7 = lVar7 + 0x14;
    } while (sVar1 * 0x14 != lVar7);
  }
  sVar1 = (this->global_variables).super_VectorView<unsigned_int>.buffer_size;
  if (sVar1 != 0) {
    puVar4 = (this->global_variables).super_VectorView<unsigned_int>.ptr;
    lVar7 = 0;
    do {
      pSVar5 = Variant::get<diligent_spirv_cross::SPIRVariable>
                         ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                          *(uint *)((long)puVar4 + lVar7));
      flush_dependees(this,pSVar5);
      lVar7 = lVar7 + 4;
    } while (sVar1 << 2 != lVar7);
  }
  flush_all_aliased_variables(this);
  return;
}

Assistant:

void Compiler::flush_all_active_variables()
{
	// Invalidate all temporaries we read from variables in this block since they were forwarded.
	// Invalidate all temporaries we read from globals.
	for (auto &v : current_function->local_variables)
		flush_dependees(get<SPIRVariable>(v));
	for (auto &arg : current_function->arguments)
		flush_dependees(get<SPIRVariable>(arg.id));
	for (auto global : global_variables)
		flush_dependees(get<SPIRVariable>(global));

	flush_all_aliased_variables();
}